

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphs.cpp
# Opt level: O0

void __thiscall Graph::graphCompress(Graph *this,Graph *dest,int n)

{
  int iVar1;
  size_type sVar2;
  reference pNVar3;
  reference pvVar4;
  reference ppVar5;
  reference pvVar6;
  bool bVar7;
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [8];
  string label;
  string local_1b8 [8];
  string r;
  string local_198 [8];
  string l;
  undefined1 local_178 [8];
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> e_1;
  iterator __end2_1;
  iterator __begin2_1;
  value_type *__range2_1;
  iterator iStack_130;
  int i_2;
  _Self local_128;
  undefined1 local_120 [8];
  Node i_1;
  iterator __end1;
  iterator __begin1;
  vector<Node,_std::allocator<Node>_> *__range1;
  undefined1 local_b8 [8];
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> e;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int local_54;
  undefined1 local_50 [4];
  int i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nodeSet;
  int n_local;
  Graph *dest_local;
  Graph *this_local;
  
  nodeSet._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = n;
  (*dest->_vptr_Graph[1])();
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_50);
  local_54 = 0;
  while( true ) {
    bVar7 = false;
    if (local_54 < nodeSet._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_) {
      iVar1 = nodeNum(this);
      bVar7 = false;
      if (local_54 < iVar1) {
        sVar2 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_50);
        bVar7 = sVar2 < (ulong)(long)nodeSet._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      }
    }
    if (!bVar7) break;
    pvVar6 = std::vector<Node,_std::allocator<Node>_>::operator[](&this->nodes,(long)local_54);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50,&pvVar6->id);
    pvVar4 = std::
             vector<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[](&this->edges,(long)local_54);
    __end2 = std::
             set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(pvVar4);
    e._32_8_ = std::
               set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(pvVar4);
    while (bVar7 = std::operator!=(&__end2,(_Self *)&e.field_0x20), bVar7) {
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&__end2);
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_b8,ppVar5);
      pvVar6 = std::vector<Node,_std::allocator<Node>_>::operator[]
                         (&this->nodes,(long)(int)local_b8._0_4_);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50,&pvVar6->id);
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_b8);
      std::
      _Rb_tree_const_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
    local_54 = local_54 + 1;
  }
  __end1 = std::vector<Node,_std::allocator<Node>_>::begin(&this->nodes);
  i_1.labels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<Node,_std::allocator<Node>_>::end(&this->nodes);
  while (bVar7 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>
                                     *)&i_1.labels.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar7)
  {
    pNVar3 = __gnu_cxx::__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>::
             operator*(&__end1);
    Node::Node((Node *)local_120,pNVar3);
    local_128._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_50,(key_type *)local_120);
    iStack_130 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_50);
    bVar7 = std::operator!=(&local_128,&stack0xfffffffffffffed0);
    if (bVar7) {
      insertNode(dest,(Node *)local_120);
    }
    Node::~Node((Node *)local_120);
    __gnu_cxx::__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>::operator++
              (&__end1);
  }
  for (__range2_1._4_4_ = 0; iVar1 = nodeNum(this), __range2_1._4_4_ < iVar1;
      __range2_1._4_4_ = __range2_1._4_4_ + 1) {
    pvVar4 = std::
             vector<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[](&this->edges,(long)__range2_1._4_4_);
    __end2_1 = std::
               set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(pvVar4);
    e_1._32_8_ = std::
                 set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end(pvVar4);
    while (bVar7 = std::operator!=(&__end2_1,(_Self *)&e_1.field_0x20), bVar7) {
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&__end2_1);
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_178,ppVar5);
      pvVar6 = std::vector<Node,_std::allocator<Node>_>::operator[]
                         (&this->nodes,(long)__range2_1._4_4_);
      std::__cxx11::string::string(local_198,(string *)pvVar6);
      pvVar6 = std::vector<Node,_std::allocator<Node>_>::operator[]
                         (&this->nodes,(long)(int)local_178._0_4_);
      std::__cxx11::string::string(local_1b8,(string *)pvVar6);
      std::__cxx11::string::string(local_1d8,(string *)&e_1);
      std::__cxx11::string::string(local_1f8,local_198);
      std::__cxx11::string::string(local_218,local_1b8);
      std::__cxx11::string::string(local_238,local_1d8);
      insertEdge(dest,(string *)local_1f8,(string *)local_218,(string *)local_238);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string(local_218);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::~string(local_198);
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_178);
      std::
      _Rb_tree_const_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2_1);
    }
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_50);
  return;
}

Assistant:

void Graph::graphCompress(Graph &dest, int n) {
    dest.clear();

    set<string> nodeSet;

    for (int i = 0; i < n && i < this->nodeNum() && nodeSet.size() < n; i++) {
        nodeSet.insert(this->nodes[i].id);
        for (pair<int, string> e : this->edges[i]) {
            nodeSet.insert(this->nodes[e.first].id);
        }
    }

    for (Node i : this->nodes) {
        if (nodeSet.find(i.id) != nodeSet.end())
            dest.insertNode(i);
    }

    for (int i = 0; i < this->nodeNum(); i++) {
        for (pair<int, string> e : this->edges[i]) {
            string l = this->nodes[i].id;
            string r = this->nodes[e.first].id;
            string label = e.second;
            dest.insertEdge(l, r, label);
        }
    }
}